

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Test.c
# Opt level: O2

int main(int argc,char **argv)

{
  char *filename;
  int iVar1;
  RDL_DimacsGraph *graph;
  RDL_graph *gra;
  RDL_data *URFdata;
  FILE *pFVar2;
  uint uVar3;
  char *__format;
  char *pcVar4;
  ulong uVar5;
  size_t sStack_40;
  int basis_validation_result;
  int timeout;
  int urf_validation_result;
  
  timeout = -1;
  if (argc < 2) {
    pcVar4 = *argv;
    __format = 
    "usage: %s mode filename [timeout=-1]\nwith mode \'demo\' for demo output of URF calculations\nor\nwith mode \'validate\' for testing/validation\n"
    ;
    goto LAB_00103596;
  }
  pcVar4 = argv[1];
  iVar1 = strcmp(pcVar4,"demo");
  if (iVar1 == 0) {
    if (argc == 2) {
      pcVar4 = *argv;
      __format = "usage: %s demo filename\n";
      goto LAB_00103596;
    }
  }
  else {
    iVar1 = strcmp(pcVar4,"validate");
    if (iVar1 != 0) {
      __format = "invalid mode \'%s\', allowed are \'demo\' and \'validate\'\n";
      goto LAB_00103596;
    }
    if (argc == 2) {
      pcVar4 = *argv;
      __format = 
      "usage: %s demo filename [timeout=-1]\nwith timeout is validation timeout in seconds, default -1 (no timeout)\n"
      ;
      goto LAB_00103596;
    }
    if ((3 < (uint)argc) && (iVar1 = __isoc99_sscanf(argv[3],"%d",&timeout), iVar1 == 0)) {
      __format = "invalid timeout in seconds: \'%s\'\n";
      pcVar4 = argv[3];
      goto LAB_00103596;
    }
  }
  filename = argv[2];
  graph = RDL_dimacsGraph_read(filename);
  if (graph != (RDL_DimacsGraph *)0x0) {
    gra = RDL_initNewGraph(graph->nof_nodes);
    for (uVar5 = 0; uVar5 < graph->nof_edges; uVar5 = uVar5 + 1) {
      RDL_addUEdge(gra,graph->edges[uVar5][0] - 1,graph->edges[uVar5][1] - 1);
    }
    RDL_setOutputFunction(RDL_writeToStderr);
    URFdata = RDL_calculate(gra);
    if (URFdata == (RDL_data *)0x0) {
      fwrite("Calculation failed!\n",0x14,1,_stderr);
      RDL_deleteGraph(gra);
      RDL_dimacsGraph_delete(graph);
      return 1;
    }
    iVar1 = strcmp(pcVar4,"demo");
    if (iVar1 == 0) {
      RDL_demo_output(URFdata);
      uVar3 = 0;
    }
    else {
      iVar1 = strcmp(pcVar4,"validate");
      if (iVar1 == 0) {
        RDL_validate(URFdata,graph,timeout,&urf_validation_result,&basis_validation_result);
        pFVar2 = _stdout;
        if (urf_validation_result == -2) {
          pcVar4 = "URF validation ran out of memory!\n";
          sStack_40 = 0x22;
        }
        else if (urf_validation_result == 0) {
          pcVar4 = "URF validation successful!\n";
          sStack_40 = 0x1b;
        }
        else if (urf_validation_result == -1) {
          pcVar4 = "URF validation timed out!\n";
          sStack_40 = 0x1a;
        }
        else {
          pcVar4 = "URF validation failed!\n";
          sStack_40 = 0x17;
          pFVar2 = _stderr;
        }
        fwrite(pcVar4,sStack_40,1,pFVar2);
        pFVar2 = _stdout;
        if (basis_validation_result == 0) {
          pcVar4 = "MCB validation successful!\n";
          sStack_40 = 0x1b;
        }
        else if (basis_validation_result == -1) {
          pcVar4 = "MCB validation timed out!\n";
          sStack_40 = 0x1a;
        }
        else {
          pcVar4 = "MCB validation failed!\n";
          sStack_40 = 0x17;
          pFVar2 = _stderr;
        }
        fwrite(pcVar4,sStack_40,1,pFVar2);
        iVar1 = RDL_checkConsistency(URFdata);
        if (iVar1 == 0) {
          pcVar4 = "consistency validation successful!\n";
          sStack_40 = 0x23;
          pFVar2 = _stdout;
        }
        else {
          pcVar4 = "consistency validation failed!\n";
          sStack_40 = 0x1f;
          pFVar2 = _stderr;
        }
        fwrite(pcVar4,sStack_40,1,pFVar2);
        uVar3 = (uint)((urf_validation_result != 0 || iVar1 != 0) || basis_validation_result != 0);
      }
      else {
        uVar3 = 1;
      }
    }
    RDL_deleteData(URFdata);
    RDL_dimacsGraph_delete(graph);
    return uVar3;
  }
  __format = "unable to read file \'%s\'\n";
  pcVar4 = filename;
LAB_00103596:
  fprintf(_stderr,__format,pcVar4);
  return 1;
}

Assistant:

int main(int argc, char **argv)
{
  const char* filename;
  RDL_graph *graph;
  RDL_data *data;
  const char* mode;
  unsigned idx;
  int timeout = -1, urf_validation_result, basis_validation_result, consistency_result;
  int return_code;

  if (argc < 2) {
    fprintf(stderr, "usage: %s mode filename [timeout=-1]\nwith mode 'demo' "
        "for demo output of URF calculations\n"
        "or\nwith mode 'validate' for testing/validation\n", argv[0]);
    return EXIT_FAILURE;
  }

  mode = argv[1];

  if (!strcmp(mode, "demo")) {
    if (argc < 3) {
      fprintf(stderr, "usage: %s demo filename\n", argv[0]);
      return EXIT_FAILURE;
    }
  }
  else if (!strcmp(mode, "validate")) {
    if (argc < 3) {
      fprintf(stderr, "usage: %s demo filename [timeout=-1]\n"
          "with timeout is validation timeout in seconds, default -1 (no timeout)\n", argv[0]);
      return EXIT_FAILURE;
    }
    if (argc > 3) {
      if (!sscanf(argv[3], "%d", &timeout)) {
        fprintf(stderr, "invalid timeout in seconds: '%s'\n", argv[3]);
        return EXIT_FAILURE;
      }
    }
  }
  else {
    fprintf(stderr, "invalid mode '%s', allowed are 'demo' and 'validate'\n", mode);
    return EXIT_FAILURE;
  }

  filename = argv[2];

  RDL_DimacsGraph* dimacs_graph = RDL_dimacsGraph_read(filename);

  if (!dimacs_graph) {
    fprintf(stderr, "unable to read file '%s'\n", filename);
    return EXIT_FAILURE;
  }

  graph = RDL_initNewGraph(dimacs_graph->nof_nodes);

  for (idx = 0; idx < dimacs_graph->nof_edges; ++idx) {
    RDL_addUEdge(graph, dimacs_graph->edges[idx][0]-1, dimacs_graph->edges[idx][1]-1);
  }

  RDL_setOutputFunction(RDL_writeToStderr);
  /* calculate Unique Ring Families */
  data = RDL_calculate(graph);
  if (!data) {
    fprintf(stderr, "Calculation failed!\n");
    RDL_deleteGraph(graph);
    RDL_dimacsGraph_delete(dimacs_graph);
    return EXIT_FAILURE;
  }

  if (!strcmp(mode, "demo")) {
    RDL_demo_output(data);
    return_code = EXIT_SUCCESS;
  }
  else if (!strcmp(mode, "validate")) {
    RDL_validate(data, dimacs_graph, timeout,
        &urf_validation_result, &basis_validation_result);
    if (urf_validation_result == -1) {
      fprintf(stdout, "URF validation timed out!\n");
    }
    else if (urf_validation_result == -2) {
      fprintf(stdout, "URF validation ran out of memory!\n");
    }
    else if (urf_validation_result == 0) {
      fprintf(stdout, "URF validation successful!\n");
    }
    else {
      fprintf(stderr, "URF validation failed!\n");
    }

    if (basis_validation_result == -1) {
      fprintf(stdout, "MCB validation timed out!\n");
    }
    else if (basis_validation_result == 0) {
      fprintf(stdout, "MCB validation successful!\n");
    }
    else {
      fprintf(stderr, "MCB validation failed!\n");
    }

    consistency_result = RDL_checkConsistency(data);
    if (consistency_result == 0) {
      fprintf(stdout, "consistency validation successful!\n");
    }
    else {
      fprintf(stderr, "consistency validation failed!\n");
    }

    if (urf_validation_result || consistency_result
        || basis_validation_result) {
      return_code = EXIT_FAILURE;
    }
    else {
      return_code = EXIT_SUCCESS;
    }
  }
  else {
    return_code = EXIT_FAILURE;
  }

  /* delete URFdata and the graph */
  RDL_deleteData(data);
  RDL_dimacsGraph_delete(dimacs_graph);

  return return_code;
}